

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O3

void __thiscall icu_63::DecimalFormat::setupFastFormat(DecimalFormat *this)

{
  ushort uVar1;
  short sVar2;
  uint uVar3;
  DecimalFormatFields *pDVar4;
  DecimalFormatProperties *pDVar5;
  DecimalFormatSymbols *pDVar6;
  bool bVar7;
  uint uVar8;
  char16_t *pcVar9;
  int iVar10;
  char16_t cVar11;
  int32_t iVar12;
  int iVar13;
  int iVar14;
  
  bVar7 = icu_63::number::impl::DecimalFormatProperties::equalsDefaultExceptFastFormat
                    ((this->fields->properties).
                     super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr);
  pDVar4 = this->fields;
  if (bVar7) {
    pDVar5 = (pDVar4->properties).
             super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr;
    uVar1 = (pDVar5->negativePrefixPattern).fUnion.fStackFields.fLengthAndFlags;
    bVar7 = true;
    if ((uVar1 & 1) == 0) {
      if ((short)uVar1 < 0) {
        iVar12 = (pDVar5->negativePrefixPattern).fUnion.fFields.fLength;
      }
      else {
        iVar12 = (int)(short)uVar1 >> 5;
      }
      if (iVar12 != 1) goto LAB_002da399;
      if ((uVar1 & 2) == 0) {
        pcVar9 = (pDVar5->negativePrefixPattern).fUnion.fFields.fArray;
      }
      else {
        pcVar9 = (pDVar5->negativePrefixPattern).fUnion.fStackFields.fBuffer;
      }
      bVar7 = *pcVar9 == L'-';
    }
    if ((bVar7) &&
       ((ushort)((pDVar5->positiveSuffixPattern).fUnion.fStackFields.fLengthAndFlags |
                 (pDVar5->positivePrefixPattern).fUnion.fStackFields.fLengthAndFlags |
                (pDVar5->negativeSuffixPattern).fUnion.fStackFields.fLengthAndFlags) < 0x20)) {
      bVar7 = pDVar5->groupingUsed;
      iVar13 = pDVar5->groupingSize;
      pDVar6 = (pDVar4->symbols).super_LocalPointerBase<const_icu_63::DecimalFormatSymbols>.ptr;
      if (bVar7 == true) {
        if (0 < iVar13 && iVar13 != 3) goto LAB_002da399;
        if (*(short *)&pDVar6->field_0x50 < 0) {
          iVar10 = *(int *)&pDVar6->field_0x54;
        }
        else {
          iVar10 = (int)*(short *)&pDVar6->field_0x50 >> 5;
        }
        if (iVar10 != 1) goto LAB_002da399;
      }
      pDVar5 = (pDVar4->exportedProperties).
               super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr;
      iVar10 = pDVar5->minimumIntegerDigits;
      if ((iVar10 < 0xb) && (pDVar5->minimumFractionDigits < 1)) {
        uVar8 = pDVar6->fCodePointZero;
        if (*(short *)&pDVar6->field_0x190 < 0) {
          iVar14 = *(int *)&pDVar6->field_0x194;
        }
        else {
          iVar14 = (int)*(short *)&pDVar6->field_0x190 >> 5;
        }
        if ((uVar8 < 0x10000) && (iVar14 == 1)) {
          uVar3 = pDVar5->maximumIntegerDigits;
          pDVar4->canUseFastFormat = true;
          (pDVar4->fastData).cpZero = (char16_t)uVar8;
          if ((bVar7 & iVar13 == 3) == 1) {
            sVar2 = *(short *)&pDVar6->field_0x50;
            if (sVar2 < 0) {
              iVar13 = *(int *)&pDVar6->field_0x54;
            }
            else {
              iVar13 = (int)sVar2 >> 5;
            }
            if (iVar13 == 0) {
              cVar11 = L'\xffff';
            }
            else {
              if (((int)sVar2 & 2U) == 0) {
                pcVar9 = *(char16_t **)&pDVar6->field_0x60;
              }
              else {
                pcVar9 = (char16_t *)&pDVar6->field_0x52;
              }
              cVar11 = *pcVar9;
            }
          }
          else {
            cVar11 = L'\0';
          }
          (pDVar4->fastData).cpGroupingSeparator = cVar11;
          sVar2 = *(short *)&pDVar6->field_0x190;
          if (sVar2 < 0) {
            iVar13 = *(int *)&pDVar6->field_0x194;
          }
          else {
            iVar13 = (int)sVar2 >> 5;
          }
          if (iVar13 == 0) {
            cVar11 = L'\xffff';
          }
          else {
            if (((int)sVar2 & 2U) == 0) {
              pcVar9 = *(char16_t **)&pDVar6->field_0x1a0;
            }
            else {
              pcVar9 = (char16_t *)&pDVar6->field_0x192;
            }
            cVar11 = *pcVar9;
          }
          (pDVar4->fastData).cpMinusSign = cVar11;
          iVar13 = 0;
          if (0 < iVar10) {
            iVar13 = iVar10;
          }
          (pDVar4->fastData).minInt = (int8_t)iVar13;
          uVar8 = 0x7f;
          if (uVar3 < 0x7f) {
            uVar8 = uVar3;
          }
          (pDVar4->fastData).maxInt = (int8_t)uVar8;
          return;
        }
      }
    }
  }
LAB_002da399:
  pDVar4->canUseFastFormat = false;
  return;
}

Assistant:

void DecimalFormat::setupFastFormat() {
    // Check the majority of properties:
    if (!fields->properties->equalsDefaultExceptFastFormat()) {
        trace("no fast format: equality\n");
        fields->canUseFastFormat = false;
        return;
    }

    // Now check the remaining properties.
    // Nontrivial affixes:
    UBool trivialPP = fields->properties->positivePrefixPattern.isEmpty();
    UBool trivialPS = fields->properties->positiveSuffixPattern.isEmpty();
    UBool trivialNP = fields->properties->negativePrefixPattern.isBogus() || (
            fields->properties->negativePrefixPattern.length() == 1 &&
            fields->properties->negativePrefixPattern.charAt(0) == u'-');
    UBool trivialNS = fields->properties->negativeSuffixPattern.isEmpty();
    if (!trivialPP || !trivialPS || !trivialNP || !trivialNS) {
        trace("no fast format: affixes\n");
        fields->canUseFastFormat = false;
        return;
    }

    // Grouping (secondary grouping is forbidden in equalsDefaultExceptFastFormat):
    bool groupingUsed = fields->properties->groupingUsed;
    int32_t groupingSize = fields->properties->groupingSize;
    bool unusualGroupingSize = groupingSize > 0 && groupingSize != 3;
    const UnicodeString& groupingString = fields->symbols->getConstSymbol(DecimalFormatSymbols::kGroupingSeparatorSymbol);
    if (groupingUsed && (unusualGroupingSize || groupingString.length() != 1)) {
        trace("no fast format: grouping\n");
        fields->canUseFastFormat = false;
        return;
    }

    // Integer length:
    int32_t minInt = fields->exportedProperties->minimumIntegerDigits;
    int32_t maxInt = fields->exportedProperties->maximumIntegerDigits;
    // Fastpath supports up to only 10 digits (length of INT32_MIN)
    if (minInt > 10) {
        trace("no fast format: integer\n");
        fields->canUseFastFormat = false;
        return;
    }

    // Fraction length (no fraction part allowed in fast path):
    int32_t minFrac = fields->exportedProperties->minimumFractionDigits;
    if (minFrac > 0) {
        trace("no fast format: fraction\n");
        fields->canUseFastFormat = false;
        return;
    }

    // Other symbols:
    const UnicodeString& minusSignString = fields->symbols->getConstSymbol(DecimalFormatSymbols::kMinusSignSymbol);
    UChar32 codePointZero = fields->symbols->getCodePointZero();
    if (minusSignString.length() != 1 || U16_LENGTH(codePointZero) != 1) {
        trace("no fast format: symbols\n");
        fields->canUseFastFormat = false;
        return;
    }

    // Good to go!
    trace("can use fast format!\n");
    fields->canUseFastFormat = true;
    fields->fastData.cpZero = static_cast<char16_t>(codePointZero);
    fields->fastData.cpGroupingSeparator = groupingUsed && groupingSize == 3 ? groupingString.charAt(0) : 0;
    fields->fastData.cpMinusSign = minusSignString.charAt(0);
    fields->fastData.minInt = (minInt < 0 || minInt > 127) ? 0 : static_cast<int8_t>(minInt);
    fields->fastData.maxInt = (maxInt < 0 || maxInt > 127) ? 127 : static_cast<int8_t>(maxInt);
}